

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeletal_mesh.h
# Opt level: O3

void __thiscall SkeletalMesh::Scene::render(Scene *this)

{
  Texture *pTVar1;
  pointer pMVar2;
  GLuint GVar3;
  ulong uVar4;
  long lVar5;
  
  if (this->available == true) {
    (*__glewBindVertexArray)(this->vao);
    pMVar2 = (this->meshEntry).
             super__Vector_base<SkeletalMesh::MeshEntry,_std::allocator<SkeletalMesh::MeshEntry>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((this->meshEntry).
        super__Vector_base<SkeletalMesh::MeshEntry,_std::allocator<SkeletalMesh::MeshEntry>_>.
        _M_impl.super__Vector_impl_data._M_finish != pMVar2) {
      lVar5 = 0;
      uVar4 = 0;
      do {
        pTVar1 = (this->material).
                 super__Vector_base<SkeletalMesh::Material,_std::allocator<SkeletalMesh::Material>_>
                 ._M_impl.super__Vector_impl_data._M_start
                 [*(uint *)((long)&pMVar2->materialIndex + lVar5)].diffuse;
        GVar3 = 0;
        if (pTVar1->available == true) {
          (*__glewActiveTexture)(0x84c0);
          GVar3 = pTVar1->tex;
        }
        glBindTexture(0xde1,GVar3);
        pMVar2 = (this->meshEntry).
                 super__Vector_base<SkeletalMesh::MeshEntry,_std::allocator<SkeletalMesh::MeshEntry>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        (*__glewDrawElementsBaseVertex)
                  (4,*(GLsizei *)((long)&pMVar2->facetCornerNum + lVar5),0x1405,
                   (void *)((ulong)*(uint *)((long)&pMVar2->indexOffset + lVar5) << 2),
                   *(GLint *)((long)&pMVar2->vertexOffset + lVar5));
        uVar4 = uVar4 + 1;
        pMVar2 = (this->meshEntry).
                 super__Vector_base<SkeletalMesh::MeshEntry,_std::allocator<SkeletalMesh::MeshEntry>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar5 = lVar5 + 0x10;
      } while (uVar4 < (ulong)((long)(this->meshEntry).
                                     super__Vector_base<SkeletalMesh::MeshEntry,_std::allocator<SkeletalMesh::MeshEntry>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar2 >> 4)
              );
    }
    (*__glewBindVertexArray)(0);
    return;
  }
  return;
}

Assistant:

void render() const {
            if (!available) return;
            glBindVertexArray(vao);
            for (int i = 0; i < meshEntry.size(); i++) {
                if (!material[meshEntry[i].materialIndex].diffuse->bind(
                        SCENE_RESOURCE_SHADER_DIFFUSE_CHANNEL))
                    glBindTexture(GL_TEXTURE_2D, 0);

                glDrawElementsBaseVertex(GL_TRIANGLES,
                                         meshEntry[i].facetCornerNum,
                                         GL_UNSIGNED_INT,
                                         (void *) (sizeof(unsigned int) * meshEntry[i].indexOffset),
                                         meshEntry[i].vertexOffset);
            }
            glBindVertexArray(0);
        }